

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::IsLeftFaceVisited
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = true;
  if (corner_id.value_ != 0xffffffff) {
    if (corner_id.value_ * -0x55555555 < 0x55555556) {
      uVar1 = corner_id.value_ + 2;
      if (uVar1 == 0xffffffff) {
        return true;
      }
    }
    else {
      uVar1 = corner_id.value_ - 1;
    }
    uVar1 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)
                                ->opposite_corners_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     + (ulong)uVar1 * 4);
    if (uVar1 != 0xffffffff) {
      bVar2 = (*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p + (ulong)(uVar1 / 0x18 & 0xfffffff8)) >>
               ((ulong)uVar1 / 3 & 0x3f) & 1) != 0;
    }
  }
  return bVar2;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::IsLeftFaceVisited(
    CornerIndex corner_id) const {
  const CornerIndex prev_corner_id = corner_table_->Previous(corner_id);
  const CornerIndex opp_corner_id = corner_table_->Opposite(prev_corner_id);
  if (opp_corner_id != kInvalidCornerIndex) {
    return visited_faces_[corner_table_->Face(opp_corner_id).value()];
  }
  // Else we are on a boundary.
  return true;
}